

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

void Bmc_CexEssentialBitTest(Gia_Man_t *p,Abc_Cex_t *pCexState)

{
  Abc_Cex_t *pCex;
  Gia_Obj_t *pGVar1;
  uint iBit;
  char *__s;
  int iVar2;
  
  iVar2 = 0;
  for (iBit = 0; (int)iBit < pCexState->nBits; iBit = iBit + 1) {
    if ((iBit / 100) * 100 + iVar2 == 0) {
      pCex = Bmc_CexEssentialBitOne(p,pCexState,iBit,(Abc_Cex_t *)0x0,(int *)0x0);
      Bmc_CexPrint(pCex,p->vCis->nSize - p->nRegs,0);
      pGVar1 = Gia_ManPo(p,pCexState->iPo);
      __s = "Essential";
      if ((*(ulong *)pGVar1 >> 0x3e & 1) != 0) {
        __s = "Not essential";
      }
      puts(__s);
      Abc_CexFree(pCex);
    }
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void Bmc_CexEssentialBitTest( Gia_Man_t * p, Abc_Cex_t * pCexState )
{
    Abc_Cex_t * pNew;
    int b;
    for ( b = 0; b < pCexState->nBits; b++ )
    {
        if ( b % 100 )
            continue;
        pNew = Bmc_CexEssentialBitOne( p, pCexState, b, NULL, NULL );
        Bmc_CexPrint( pNew, Gia_ManPiNum(p), 0 );

        if ( Gia_ManPo(p, pCexState->iPo)->fMark1 )
            printf( "Not essential\n" );
        else
            printf( "Essential\n" );

        Abc_CexFree( pNew );
    }
}